

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

bool __thiscall
CLI::App::_parse_arg
          (App *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,Classifier current_type)

{
  size_t sVar1;
  undefined4 uVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  Classifier CVar6;
  reference pvVar7;
  HorribleError *pHVar8;
  element_type *peVar9;
  App *this_00;
  pointer pOVar10;
  int *piVar11;
  ArgumentMismatch *__return_storage_ptr__;
  size_type sVar12;
  ulong uVar13;
  byte local_4e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  string local_3e8;
  pointer local_3c8;
  string local_3c0;
  string local_3a0;
  undefined1 local_380 [8];
  string res_1;
  string local_358;
  size_t local_338;
  size_t remreqpos;
  string local_328;
  string local_308;
  pointer local_2e8;
  string local_2e0;
  string local_2c0 [8];
  string current_;
  string local_298;
  pointer local_278;
  string local_270;
  pointer local_250;
  string local_248;
  string local_228;
  undefined1 local_208 [8];
  string res;
  int result_count;
  int collected;
  int max_num;
  int local_1d4;
  reference puStack_1d0;
  int min_num;
  Option_p *op;
  __shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_1c0;
  shared_ptr<CLI::App> *subc;
  iterator __end3;
  iterator __begin3;
  vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *__range3;
  anon_class_40_2_a297e68f_for__M_pred local_198;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  local_170;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  local_168;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  local_160;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  op_ptr;
  string local_150;
  undefined1 local_12a;
  allocator local_129;
  string local_128;
  undefined1 local_102;
  allocator local_101;
  string local_100;
  undefined1 local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  undefined1 local_a8 [8];
  string rest;
  string value;
  string arg_name;
  string current;
  Classifier current_type_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  App *this_local;
  
  pvVar7 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::back(args);
  ::std::__cxx11::string::string((string *)(arg_name.field_2._M_local_buf + 8),(string *)pvVar7);
  ::std::__cxx11::string::string((string *)(value.field_2._M_local_buf + 8));
  ::std::__cxx11::string::string((string *)(rest.field_2._M_local_buf + 8));
  ::std::__cxx11::string::string((string *)local_a8);
  switch(current_type) {
  case NONE:
  case POSITIONAL_MARK:
  case SUBCOMMAND:
  case SUBCOMMAND_TERMINATOR:
  default:
    op_ptr._M_current._6_1_ = 1;
    pHVar8 = (HorribleError *)__cxa_allocate_exception(0x38);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_150,
               "parsing got called with invalid option! You should not see this",
               (allocator *)((long)&op_ptr._M_current + 7));
    HorribleError::HorribleError(pHVar8,&local_150);
    op_ptr._M_current._6_1_ = 0;
    __cxa_throw(pHVar8,&HorribleError::typeinfo,HorribleError::~HorribleError);
  case SHORT:
    bVar3 = detail::split_short((string *)((long)&arg_name.field_2 + 8),
                                (string *)((long)&value.field_2 + 8),(string *)local_a8);
    if (!bVar3) {
      local_102 = 1;
      pHVar8 = (HorribleError *)__cxa_allocate_exception(0x38);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_100,"Short parsed but missing! You should not see this",&local_101
                );
      HorribleError::HorribleError(pHVar8,&local_100);
      local_102 = 0;
      __cxa_throw(pHVar8,&HorribleError::typeinfo,HorribleError::~HorribleError);
    }
    break;
  case LONG:
    bVar3 = detail::split_long((string *)((long)&arg_name.field_2 + 8),
                               (string *)((long)&value.field_2 + 8),
                               (string *)((long)&rest.field_2 + 8));
    if (!bVar3) {
      local_d9 = 1;
      pHVar8 = (HorribleError *)__cxa_allocate_exception(0x38);
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::back(args);
      ::std::operator+(&local_d8,"Long parsed but missing (you should not see this):",pvVar7);
      HorribleError::HorribleError(pHVar8,&local_d8);
      local_d9 = 0;
      __cxa_throw(pHVar8,&HorribleError::typeinfo,HorribleError::~HorribleError);
    }
    break;
  case WINDOWS:
    bVar3 = detail::split_windows_style
                      ((string *)((long)&arg_name.field_2 + 8),(string *)((long)&value.field_2 + 8),
                       (string *)((long)&rest.field_2 + 8));
    if (!bVar3) {
      local_12a = 1;
      pHVar8 = (HorribleError *)__cxa_allocate_exception(0x38);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_128,"windows option parsed but missing! You should not see this",
                 &local_129);
      HorribleError::HorribleError(pHVar8,&local_128);
      local_12a = 0;
      __cxa_throw(pHVar8,&HorribleError::typeinfo,HorribleError::~HorribleError);
    }
  }
  local_168._M_current =
       (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
       ::std::
       begin<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                 (&this->options_);
  local_170._M_current =
       (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
       ::std::
       end<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                 (&this->options_);
  ::std::__cxx11::string::string((string *)&local_198,(string *)(value.field_2._M_local_buf + 8));
  local_198.current_type = current_type;
  local_160 = ::std::
              find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>*,std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>,CLI::App::_parse_arg(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,CLI::detail::Classifier)::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_1_>
                        (local_168,local_170,&local_198);
  _parse_arg(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,CLI::detail::Classifier)
  ::{lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)#1}::~unique_ptr
            ((_lambda_std__unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const___1_ *)
             &local_198);
  __range3 = (vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *)
             ::std::
             end<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                       (&this->options_);
  bVar3 = __gnu_cxx::operator==
                    (&local_160,
                     (__normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                      *)&__range3);
  if (bVar3) {
    __end3 = std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::
             begin(&this->subcommands_);
    subc = (shared_ptr<CLI::App> *)
           std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::end
                     (&this->subcommands_);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                                       *)&subc), bVar3) {
      local_1c0 = (__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                  __gnu_cxx::
                  __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                  ::operator*(&__end3);
      std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                (local_1c0);
      uVar13 = ::std::__cxx11::string::empty();
      if (((uVar13 & 1) != 0) &&
         (peVar9 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->(local_1c0), (peVar9->disabled_ & 1U) == 0)) {
        peVar9 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(local_1c0);
        bVar3 = _parse_arg(peVar9,args,current_type);
        if (bVar3) {
          peVar9 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->(local_1c0);
          if ((peVar9->pre_parse_called_ & 1U) == 0) {
            peVar9 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->(local_1c0);
            sVar12 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::size(args);
            _trigger_pre_parse(peVar9,sVar12);
          }
          this_local._7_1_ = true;
          goto LAB_0018ee7a;
        }
      }
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
      ::operator++(&__end3);
    }
    if ((this->parent_ == (App *)0x0) || ((this->fallthrough_ & 1U) == 0)) {
      if ((this->parent_ == (App *)0x0) ||
         (uVar13 = ::std::__cxx11::string::empty(), (uVar13 & 1) == 0)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::pop_back(args);
        _move_to_missing(this,current_type,(string *)((long)&arg_name.field_2 + 8));
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_00 = _get_fallthrough_parent(this);
      this_local._7_1_ = _parse_arg(this_00,args,current_type);
    }
    goto LAB_0018ee7a;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::pop_back(args);
  puStack_1d0 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                ::operator*(&local_160);
  pOVar10 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(puStack_1d0)
  ;
  max_num = Option::get_type_size_min(pOVar10);
  pOVar10 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(puStack_1d0)
  ;
  collected = Option::get_items_expected_min(pOVar10);
  piVar11 = std::min<int>(&max_num,&collected);
  local_1d4 = *piVar11;
  pOVar10 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(puStack_1d0)
  ;
  iVar5 = Option::get_items_expected_max(pOVar10);
  res.field_2._12_4_ = 0;
  res.field_2._8_4_ = 0;
  if (iVar5 == 0) {
    pOVar10 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                        (puStack_1d0);
    ::std::__cxx11::string::string((string *)&local_228,(string *)(rest.field_2._M_local_buf + 8));
    Option::get_flag_value
              ((string *)local_208,pOVar10,(string *)((long)&value.field_2 + 8),&local_228);
    ::std::__cxx11::string::~string((string *)&local_228);
    pOVar10 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                        (puStack_1d0);
    ::std::__cxx11::string::string((string *)&local_248,(string *)local_208);
    Option::add_result(pOVar10,&local_248);
    ::std::__cxx11::string::~string((string *)&local_248);
    local_250 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::get(puStack_1d0);
    std::vector<CLI::Option_*,_std::allocator<CLI::Option_*>_>::push_back
              (&this->parse_order_,&local_250);
    ::std::__cxx11::string::~string((string *)local_208);
  }
  else {
    uVar13 = ::std::__cxx11::string::empty();
    if ((uVar13 & 1) == 0) {
      pOVar10 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                          (puStack_1d0);
      ::std::__cxx11::string::string((string *)&local_270,(string *)(rest.field_2._M_local_buf + 8))
      ;
      Option::add_result(pOVar10,&local_270,(int *)(res.field_2._M_local_buf + 8));
      ::std::__cxx11::string::~string((string *)&local_270);
      local_278 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::get(puStack_1d0);
      std::vector<CLI::Option_*,_std::allocator<CLI::Option_*>_>::push_back
                (&this->parse_order_,&local_278);
      res.field_2._12_4_ = res.field_2._8_4_ + res.field_2._12_4_;
    }
    else {
      uVar13 = ::std::__cxx11::string::empty();
      if ((uVar13 & 1) == 0) {
        pOVar10 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                            (puStack_1d0);
        ::std::__cxx11::string::string((string *)&local_298,(string *)local_a8);
        Option::add_result(pOVar10,&local_298,(int *)(res.field_2._M_local_buf + 8));
        ::std::__cxx11::string::~string((string *)&local_298);
        current_.field_2._8_8_ =
             std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::get(puStack_1d0);
        std::vector<CLI::Option_*,_std::allocator<CLI::Option_*>_>::push_back
                  (&this->parse_order_,(value_type *)((long)&current_.field_2 + 8));
        ::std::__cxx11::string::operator=((string *)local_a8,"");
        res.field_2._12_4_ = res.field_2._8_4_ + res.field_2._12_4_;
      }
    }
  }
  while( true ) {
    local_4e1 = 0;
    if ((int)res.field_2._12_4_ < local_1d4) {
      bVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(args);
      local_4e1 = bVar3 ^ 0xff;
    }
    if ((local_4e1 & 1) == 0) break;
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::back(args);
    ::std::__cxx11::string::string(local_2c0,(string *)pvVar7);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_back(args);
    pOVar10 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                        (puStack_1d0);
    ::std::__cxx11::string::string((string *)&local_2e0,local_2c0);
    Option::add_result(pOVar10,&local_2e0,(int *)(res.field_2._M_local_buf + 8));
    ::std::__cxx11::string::~string((string *)&local_2e0);
    local_2e8 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::get(puStack_1d0);
    std::vector<CLI::Option_*,_std::allocator<CLI::Option_*>_>::push_back
              (&this->parse_order_,&local_2e8);
    res.field_2._12_4_ = res.field_2._8_4_ + res.field_2._12_4_;
    ::std::__cxx11::string::~string(local_2c0);
  }
  if ((int)res.field_2._12_4_ < local_1d4) {
    remreqpos._7_1_ = 1;
    __return_storage_ptr__ = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
    pOVar10 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                        (puStack_1d0);
    Option::get_name_abi_cxx11_(&local_308,pOVar10,false,false);
    iVar5 = local_1d4;
    pOVar10 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                        (puStack_1d0);
    Option::get_type_name_abi_cxx11_(&local_328,pOVar10);
    ArgumentMismatch::TypedAtLeast(__return_storage_ptr__,&local_308,iVar5,&local_328);
    remreqpos._7_1_ = 0;
    __cxa_throw(__return_storage_ptr__,&ArgumentMismatch::typeinfo,
                ArgumentMismatch::~ArgumentMismatch);
  }
  if ((int)res.field_2._12_4_ < iVar5) {
LAB_0018e9b1:
    local_338 = _count_remaining_positionals(this,true);
    do {
      if ((int)res.field_2._12_4_ < iVar5) {
LAB_0018ea08:
        bVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty(args);
        bVar3 = false;
        if (!bVar4) {
          pvVar7 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::back(args);
          CVar6 = _recognize(this,pvVar7,false);
          bVar3 = CVar6 == NONE;
        }
      }
      else {
        pOVar10 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                            (puStack_1d0);
        bVar4 = Option::get_allow_extra_args(pOVar10);
        bVar3 = false;
        if (bVar4) goto LAB_0018ea08;
      }
      sVar1 = local_338;
      if ((!bVar3) ||
         (sVar12 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size(args), sVar12 <= sVar1)) goto LAB_0018eb62;
      pOVar10 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                          (puStack_1d0);
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::back(args);
      ::std::__cxx11::string::string((string *)&local_358,(string *)pvVar7);
      Option::add_result(pOVar10,&local_358,(int *)(res.field_2._M_local_buf + 8));
      ::std::__cxx11::string::~string((string *)&local_358);
      res_1.field_2._8_8_ =
           std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::get(puStack_1d0);
      std::vector<CLI::Option_*,_std::allocator<CLI::Option_*>_>::push_back
                (&this->parse_order_,(value_type *)((long)&res_1.field_2 + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_back(args);
      res.field_2._12_4_ = res.field_2._8_4_ + res.field_2._12_4_;
    } while( true );
  }
  pOVar10 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(puStack_1d0)
  ;
  bVar3 = Option::get_allow_extra_args(pOVar10);
  if (bVar3) goto LAB_0018e9b1;
LAB_0018ed1c:
  if (0 < local_1d4) {
    pOVar10 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                        (puStack_1d0);
    iVar5 = Option::get_type_size_max(pOVar10);
    uVar2 = res.field_2._12_4_;
    if (iVar5 != local_1d4) {
      pOVar10 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                          (puStack_1d0);
      iVar5 = Option::get_type_size_max(pOVar10);
      if ((int)uVar2 % iVar5 != 0) {
        pOVar10 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                            (puStack_1d0);
        ::std::__cxx11::string::string((string *)&local_3e8);
        Option::add_result(pOVar10,&local_3e8);
        ::std::__cxx11::string::~string((string *)&local_3e8);
      }
    }
  }
  uVar13 = ::std::__cxx11::string::empty();
  if ((uVar13 & 1) == 0) {
    ::std::operator+(&local_408,"-",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
    ::std::__cxx11::string::operator=((string *)local_a8,(string *)&local_408);
    ::std::__cxx11::string::~string((string *)&local_408);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(args,(value_type *)local_a8);
  }
  this_local._7_1_ = true;
LAB_0018ee7a:
  op._4_4_ = 1;
  ::std::__cxx11::string::~string((string *)local_a8);
  ::std::__cxx11::string::~string((string *)(rest.field_2._M_local_buf + 8));
  ::std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
  ::std::__cxx11::string::~string((string *)(arg_name.field_2._M_local_buf + 8));
  return this_local._7_1_;
LAB_0018eb62:
  bVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(args);
  if (!bVar3) {
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::back(args);
    CVar6 = _recognize(this,pvVar7,true);
    if (CVar6 == POSITIONAL_MARK) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_back(args);
    }
  }
  if (((local_1d4 == 0) && (0 < iVar5)) && (res.field_2._12_4_ == 0)) {
    pOVar10 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                        (puStack_1d0);
    ::std::__cxx11::string::string((string *)&local_3a0);
    Option::get_flag_value
              ((string *)local_380,pOVar10,(string *)((long)&value.field_2 + 8),&local_3a0);
    ::std::__cxx11::string::~string((string *)&local_3a0);
    pOVar10 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                        (puStack_1d0);
    ::std::__cxx11::string::string((string *)&local_3c0,(string *)local_380);
    Option::add_result(pOVar10,&local_3c0);
    ::std::__cxx11::string::~string((string *)&local_3c0);
    local_3c8 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::get(puStack_1d0);
    std::vector<CLI::Option_*,_std::allocator<CLI::Option_*>_>::push_back
              (&this->parse_order_,&local_3c8);
    ::std::__cxx11::string::~string((string *)local_380);
  }
  goto LAB_0018ed1c;
}

Assistant:

bool _parse_arg(std::vector<std::string> &args, detail::Classifier current_type) {

        std::string current = args.back();

        std::string arg_name;
        std::string value;
        std::string rest;

        switch(current_type) {
        case detail::Classifier::LONG:
            if(!detail::split_long(current, arg_name, value))
                throw HorribleError("Long parsed but missing (you should not see this):" + args.back());
            break;
        case detail::Classifier::SHORT:
            if(!detail::split_short(current, arg_name, rest))
                throw HorribleError("Short parsed but missing! You should not see this");
            break;
        case detail::Classifier::WINDOWS:
            if(!detail::split_windows_style(current, arg_name, value))
                throw HorribleError("windows option parsed but missing! You should not see this");
            break;
        case detail::Classifier::SUBCOMMAND:
        case detail::Classifier::SUBCOMMAND_TERMINATOR:
        case detail::Classifier::POSITIONAL_MARK:
        case detail::Classifier::NONE:
        default:
            throw HorribleError("parsing got called with invalid option! You should not see this");
        }

        auto op_ptr =
            std::find_if(std::begin(options_), std::end(options_), [arg_name, current_type](const Option_p &opt) {
                if(current_type == detail::Classifier::LONG)
                    return opt->check_lname(arg_name);
                if(current_type == detail::Classifier::SHORT)
                    return opt->check_sname(arg_name);
                // this will only get called for detail::Classifier::WINDOWS
                return opt->check_lname(arg_name) || opt->check_sname(arg_name);
            });

        // Option not found
        if(op_ptr == std::end(options_)) {
            for(auto &subc : subcommands_) {
                if(subc->name_.empty() && !subc->disabled_) {
                    if(subc->_parse_arg(args, current_type)) {
                        if(!subc->pre_parse_called_) {
                            subc->_trigger_pre_parse(args.size());
                        }
                        return true;
                    }
                }
            }
            // If a subcommand, try the master command
            if(parent_ != nullptr && fallthrough_)
                return _get_fallthrough_parent()->_parse_arg(args, current_type);
            // don't capture missing if this is a nameless subcommand
            if(parent_ != nullptr && name_.empty()) {
                return false;
            }
            // Otherwise, add to missing
            args.pop_back();
            _move_to_missing(current_type, current);
            return true;
        }

        args.pop_back();

        // Get a reference to the pointer to make syntax bearable
        Option_p &op = *op_ptr;

        int min_num = (std::min)(op->get_type_size_min(), op->get_items_expected_min());
        int max_num = op->get_items_expected_max();

        // Make sure we always eat the minimum for unlimited vectors
        int collected = 0;    // total number of arguments collected
        int result_count = 0; // local variable for number of results in a single arg string
        // deal with purely flag like things
        if(max_num == 0) {
            auto res = op->get_flag_value(arg_name, value);
            op->add_result(res);
            parse_order_.push_back(op.get());
        } else if(!value.empty()) { // --this=value
            op->add_result(value, result_count);
            parse_order_.push_back(op.get());
            collected += result_count;
            // -Trest
        } else if(!rest.empty()) {
            op->add_result(rest, result_count);
            parse_order_.push_back(op.get());
            rest = "";
            collected += result_count;
        }

        // gather the minimum number of arguments
        while(min_num > collected && !args.empty()) {
            std::string current_ = args.back();
            args.pop_back();
            op->add_result(current_, result_count);
            parse_order_.push_back(op.get());
            collected += result_count;
        }

        if(min_num > collected) { // if we have run out of arguments and the minimum was not met
            throw ArgumentMismatch::TypedAtLeast(op->get_name(), min_num, op->get_type_name());
        }

        if(max_num > collected || op->get_allow_extra_args()) { // we allow optional arguments
            auto remreqpos = _count_remaining_positionals(true);
            // we have met the minimum now optionally check up to the maximum
            while((collected < max_num || op->get_allow_extra_args()) && !args.empty() &&
                  _recognize(args.back(), false) == detail::Classifier::NONE) {
                // If any required positionals remain, don't keep eating
                if(remreqpos >= args.size()) {
                    break;
                }

                op->add_result(args.back(), result_count);
                parse_order_.push_back(op.get());
                args.pop_back();
                collected += result_count;
            }

            // Allow -- to end an unlimited list and "eat" it
            if(!args.empty() && _recognize(args.back()) == detail::Classifier::POSITIONAL_MARK)
                args.pop_back();
            // optional flag that didn't receive anything now get the default value
            if(min_num == 0 && max_num > 0 && collected == 0) {
                auto res = op->get_flag_value(arg_name, std::string{});
                op->add_result(res);
                parse_order_.push_back(op.get());
            }
        }

        // if we only partially completed a type then add an empty string for later processing
        if(min_num > 0 && op->get_type_size_max() != min_num && collected % op->get_type_size_max() != 0) {
            op->add_result(std::string{});
        }

        if(!rest.empty()) {
            rest = "-" + rest;
            args.push_back(rest);
        }
        return true;
    }